

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert.cpp
# Opt level: O2

string * __thiscall
libtorrent::peer_unsnubbed_alert::message_abi_cxx11_
          (string *__return_storage_ptr__,peer_unsnubbed_alert *this)

{
  string local_30;
  
  peer_alert::message_abi_cxx11_(&local_30,&this->super_peer_alert);
  std::operator+(__return_storage_ptr__,&local_30," peer unsnubbed");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string peer_unsnubbed_alert::message() const
	{
		return peer_alert::message() + " peer unsnubbed";
	}